

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O1

void __thiscall CSocekt::flyd_close_listening_sockets(CSocekt *this)

{
  char *pcVar1;
  LogStream *this_00;
  int iVar2;
  char **ppcVar3;
  long lVar4;
  SourceFile file;
  SourceFile file_00;
  Logger LStack_1008;
  
  if (0 < this->m_ListenPortCount) {
    iVar2 = (int)&LStack_1008 + 0xfb8;
    lVar4 = 0;
    do {
      if (muduo::g_logLevel < 2) {
        file._8_8_ = 0xe;
        file.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&LStack_1008,file,0x140,DEBUG,"flyd_close_listening_sockets");
        if (10 < (uint)(iVar2 - (int)LStack_1008.impl_.stream_.buffer_.cur_)) {
          builtin_strncpy(LStack_1008.impl_.stream_.buffer_.cur_,"端口是 ",10);
          LStack_1008.impl_.stream_.buffer_.cur_ = LStack_1008.impl_.stream_.buffer_.cur_ + 10;
        }
        this_00 = muduo::LogStream::operator<<
                            (&LStack_1008.impl_.stream_,
                             (this->m_ListenSocketList).
                             super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar4]->port);
        ppcVar3 = &(this_00->buffer_).cur_;
        pcVar1 = (this_00->buffer_).cur_;
        if (0xb < (uint)((int)ppcVar3 - (int)pcVar1)) {
          builtin_strncpy(pcVar1,"socketid是",0xb);
          *ppcVar3 = *ppcVar3 + 0xb;
        }
        muduo::LogStream::operator<<
                  (this_00,(this->m_ListenSocketList).
                           super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar4]->fd);
        muduo::Logger::~Logger(&LStack_1008);
      }
      close((this->m_ListenSocketList).
            super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4]->fd);
      if (muduo::g_logLevel < 3) {
        file_00._8_8_ = 0xe;
        file_00.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&LStack_1008,file_00,0x142);
        if (0x12 < (uint)(iVar2 - (int)LStack_1008.impl_.stream_.buffer_.cur_)) {
          builtin_strncpy(LStack_1008.impl_.stream_.buffer_.cur_,"关闭监听端口",0x12);
          LStack_1008.impl_.stream_.buffer_.cur_ = LStack_1008.impl_.stream_.buffer_.cur_ + 0x12;
        }
        muduo::LogStream::operator<<
                  (&LStack_1008.impl_.stream_,
                   (this->m_ListenSocketList).
                   super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar4]->port);
        muduo::Logger::~Logger(&LStack_1008);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->m_ListenPortCount);
  }
  return;
}

Assistant:

void CSocekt::flyd_close_listening_sockets()
{
    for(int i = 0; i < m_ListenPortCount; i++) //要关闭这么多个监听端口
    {
        //ngx_log_stderr(0,"端口是%d,socketid是%d.",m_ListenSocketList[i]->port,m_ListenSocketList[i]->fd);
        LOG_DEBUG << "端口是 " << m_ListenSocketList[i]->port << "socketid是" << m_ListenSocketList[i]->fd;
        close(m_ListenSocketList[i]->fd);
        LOG_INFO << "关闭监听端口" << m_ListenSocketList[i]->port;
        //ngx_log_error_core(NGX_LOG_INFO,0,"关闭监听端口%d!",m_ListenSocketList[i]->port); //显示一些信息到日志中
    }//end for(int i = 0; i < m_ListenPortCount; i++)
}